

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

bitset_container_t * bitset_container_clone(bitset_container_t *src)

{
  uint64_t *puVar1;
  bitset_container_t *bitset;
  bitset_container_t *src_local;
  
  src_local = (bitset_container_t *)malloc(0x10);
  if (src_local == (bitset_container_t *)0x0) {
    src_local = (bitset_container_t *)0x0;
  }
  else {
    puVar1 = (uint64_t *)roaring_bitmap_aligned_malloc(0x20,0x2000);
    src_local->words = puVar1;
    if (src_local->words == (uint64_t *)0x0) {
      free(src_local);
      src_local = (bitset_container_t *)0x0;
    }
    else {
      src_local->cardinality = src->cardinality;
      memcpy(src_local->words,src->words,0x2000);
    }
  }
  return src_local;
}

Assistant:

bitset_container_t *bitset_container_clone(const bitset_container_t *src) {
    bitset_container_t *bitset =
        (bitset_container_t *)malloc(sizeof(bitset_container_t));

    if (!bitset) {
        return NULL;
    }
    // sizeof(__m256i) == 32
    bitset->words = (uint64_t *)roaring_bitmap_aligned_malloc(
        32, sizeof(uint64_t) * BITSET_CONTAINER_SIZE_IN_WORDS);
    if (!bitset->words) {
        free(bitset);
        return NULL;
    }
    bitset->cardinality = src->cardinality;
    memcpy(bitset->words, src->words,
           sizeof(uint64_t) * BITSET_CONTAINER_SIZE_IN_WORDS);
    return bitset;
}